

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_MixedEditionAndSyntax_Test::
ParseEditionsTest_MixedEditionAndSyntax_Test(ParseEditionsTest_MixedEditionAndSyntax_Test *this)

{
  ParseEditionsTest_MixedEditionAndSyntax_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseEditionsTest);
  (this->super_ParseEditionsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseEditionsTest_MixedEditionAndSyntax_Test_02a11988;
  return;
}

Assistant:

TEST_F(ParseEditionsTest, MixedEditionAndSyntax) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        syntax = "proto2";
        message A {
          int32 b = 1;
        })schema",
      "2:8: Expected top-level statement (e.g. \"message\").\n");
}